

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  ImDrawIdx **ppIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  ImDrawListSharedData *pIVar4;
  ImVec4 *pIVar5;
  ImDrawVert *pIVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  ImVec2 *pIVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ImVec2 *pIVar16;
  ImDrawIdx IVar17;
  uint vtx_count;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  byte bVar23;
  long lVar24;
  ImDrawIdx IVar25;
  ImDrawIdx IVar26;
  uint uVar27;
  ImDrawIdx IVar28;
  ImDrawIdx IVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  bool bVar35;
  float fVar36;
  ImVec2 IVar37;
  ImVec2 IVar38;
  ImVec2 IVar39;
  ImVec2 IVar40;
  ImVec2 IVar41;
  float fVar44;
  ImVec2 IVar42;
  ImVec2 IVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  
  if (1 < points_count) {
    uVar19 = points_count - 1;
    IVar3 = this->_Data->TexUvWhitePixel;
    uVar27 = points_count;
    if ((flags & 1U) == 0) {
      uVar27 = uVar19;
    }
    uVar32 = (ulong)uVar27;
    if ((this->Flags & 1U) == 0) {
      PrimReserve(this,uVar27 * 6,uVar27 * 4);
      if (0 < (int)uVar27) {
        uVar33 = 1;
        do {
          uVar18 = uVar33;
          if ((uint)points_count == uVar33) {
            uVar18 = 0;
          }
          fVar47 = points[uVar18].x - points[uVar33 - 1].x;
          fVar48 = points[uVar18].y - points[uVar33 - 1].y;
          fVar36 = fVar47 * fVar47 + fVar48 * fVar48;
          if (0.0 < fVar36) {
            if (fVar36 < 0.0) {
              fVar36 = sqrtf(fVar36);
            }
            else {
              fVar36 = SQRT(fVar36);
            }
            fVar47 = fVar47 * (1.0 / fVar36);
            fVar48 = fVar48 * (1.0 / fVar36);
          }
          fVar47 = thickness * 0.5 * fVar47;
          fVar48 = fVar48 * thickness * 0.5;
          (this->_VtxWritePtr->pos).x = points[uVar33 - 1].x + fVar48;
          (this->_VtxWritePtr->pos).y = points[uVar33 - 1].y - fVar47;
          this->_VtxWritePtr->uv = IVar3;
          this->_VtxWritePtr->col = col;
          this->_VtxWritePtr[1].pos.x = points[uVar18].x + fVar48;
          this->_VtxWritePtr[1].pos.y = points[uVar18].y - fVar47;
          this->_VtxWritePtr[1].uv = IVar3;
          this->_VtxWritePtr[1].col = col;
          this->_VtxWritePtr[2].pos.x = points[uVar18].x - fVar48;
          this->_VtxWritePtr[2].pos.y = points[uVar18].y + fVar47;
          this->_VtxWritePtr[2].uv = IVar3;
          this->_VtxWritePtr[2].col = col;
          this->_VtxWritePtr[3].pos.x = points[uVar33 - 1].x - fVar48;
          this->_VtxWritePtr[3].pos.y = fVar47 + points[uVar33 - 1].y;
          this->_VtxWritePtr[3].uv = IVar3;
          this->_VtxWritePtr[3].col = col;
          this->_VtxWritePtr = this->_VtxWritePtr + 4;
          *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
          this->_IdxWritePtr[1] = (short)this->_VtxCurrentIdx + 1;
          this->_IdxWritePtr[2] = (short)this->_VtxCurrentIdx + 2;
          this->_IdxWritePtr[3] = (ImDrawIdx)this->_VtxCurrentIdx;
          this->_IdxWritePtr[4] = (short)this->_VtxCurrentIdx + 2;
          this->_IdxWritePtr[5] = (short)this->_VtxCurrentIdx + 3;
          this->_IdxWritePtr = this->_IdxWritePtr + 6;
          this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
          bVar35 = uVar33 != uVar32;
          uVar33 = uVar33 + 1;
        } while (bVar35);
      }
    }
    else {
      fVar36 = thickness;
      if (thickness <= 1.0) {
        fVar36 = 1.0;
      }
      iVar21 = (int)fVar36;
      fVar47 = this->_FringeScale;
      bVar23 = fVar47 == 1.0 & iVar21 < 0x3f & (byte)this->Flags >> 1 &
               fVar36 - (float)iVar21 <= 1e-05;
      iVar30 = 0x12;
      if (thickness <= fVar47) {
        iVar30 = 0xc;
      }
      iVar20 = 6;
      if (bVar23 == 0) {
        iVar20 = iVar30;
      }
      if (bVar23 == 1) {
        vtx_count = points_count * 2;
        iVar30 = 3;
      }
      else {
        vtx_count = points_count * 3;
        if (fVar47 < thickness) {
          vtx_count = points_count * 4;
        }
        iVar30 = (uint)(fVar47 < thickness) * 2 + 3;
      }
      PrimReserve(this,iVar20 * uVar27,vtx_count);
      pIVar4 = this->_Data;
      uVar31 = iVar30 * points_count;
      if ((pIVar4->TempBuffer).Capacity < (int)uVar31) {
        pIVar12 = (pIVar4->TempBuffer).Data;
        if (pIVar12 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar12);
        }
        pIVar12 = (ImVec2 *)ImGui::MemAlloc((ulong)uVar31 << 3);
        (pIVar4->TempBuffer).Data = pIVar12;
        (pIVar4->TempBuffer).Capacity = uVar31;
      }
      pIVar12 = (this->_Data->TempBuffer).Data;
      uVar33 = (ulong)(uint)points_count;
      if (0 < (int)uVar27) {
        uVar18 = 1;
        do {
          uVar13 = uVar18;
          if (uVar33 == uVar18) {
            uVar13 = 0;
          }
          fVar45 = points[uVar13].x - points[uVar18 - 1].x;
          fVar46 = points[uVar13].y - points[uVar18 - 1].y;
          fVar48 = fVar45 * fVar45 + fVar46 * fVar46;
          if (0.0 < fVar48) {
            if (fVar48 < 0.0) {
              fVar48 = sqrtf(fVar48);
            }
            else {
              fVar48 = SQRT(fVar48);
            }
            fVar45 = fVar45 * (1.0 / fVar48);
            fVar46 = fVar46 * (1.0 / fVar48);
          }
          pIVar12[uVar18 - 1].x = fVar46;
          pIVar12[uVar18 - 1].y = -fVar45;
          bVar35 = uVar18 != uVar27;
          uVar18 = uVar18 + 1;
        } while (bVar35);
      }
      pIVar16 = pIVar12 + uVar33;
      if ((flags & 1U) == 0) {
        pIVar12[uVar19] = pIVar16[-2];
      }
      uVar31 = col & 0xffffff;
      if ((thickness <= fVar47 | bVar23) == 1) {
        if (bVar23 != 0) {
          fVar47 = fVar36 * 0.5 + 1.0;
        }
        if ((flags & 1U) == 0) {
          fVar36 = (*pIVar12).x * fVar47;
          fVar48 = (*pIVar12).y * fVar47;
          IVar38.x = (*points).x + fVar36;
          IVar38.y = (*points).y + fVar48;
          *pIVar16 = IVar38;
          IVar39.x = (*points).x - fVar36;
          IVar39.y = (*points).y - fVar48;
          pIVar16[1] = IVar39;
          IVar40.x = points[uVar19].x + pIVar12[uVar19].x * fVar47;
          IVar40.y = points[uVar19].y + pIVar12[uVar19].y * fVar47;
          pIVar16[uVar19 * 2] = IVar40;
          IVar7.y = points[uVar19].y - pIVar12[uVar19].y * fVar47;
          IVar7.x = points[uVar19].x - pIVar12[uVar19].x * fVar47;
          pIVar16[(ulong)(uVar19 * 2) + 1] = IVar7;
        }
        if (0 < (int)uVar27) {
          uVar27 = this->_VtxCurrentIdx;
          ppIVar1 = &this->_IdxWritePtr;
          uVar18 = 1;
          do {
            IVar26 = (ImDrawIdx)uVar27;
            uVar13 = uVar18 & 0xffffffff;
            if (uVar33 == uVar18) {
              uVar13 = 0;
            }
            uVar27 = uVar27 + (bVar23 ^ 3);
            if (uVar33 == uVar18) {
              uVar27 = this->_VtxCurrentIdx;
            }
            IVar17 = (ImDrawIdx)uVar27;
            fVar36 = (pIVar12[uVar13].x + pIVar12[uVar18 - 1].x) * 0.5;
            fVar48 = (pIVar12[uVar13].y + pIVar12[uVar18 - 1].y) * 0.5;
            fVar45 = fVar36 * fVar36 + fVar48 * fVar48;
            if (1e-06 < fVar45) {
              fVar45 = 1.0 / fVar45;
              fVar46 = 100.0;
              if (fVar45 <= 100.0) {
                fVar46 = fVar45;
              }
              fVar36 = fVar36 * fVar46;
              fVar48 = fVar48 * fVar46;
            }
            uVar14 = (ulong)(uint)((int)uVar13 * 2);
            pIVar16[uVar14].x = points[uVar13].x + fVar47 * fVar36;
            pIVar16[uVar14].y = points[uVar13].y + fVar48 * fVar47;
            pIVar16[uVar14 + 1].x = points[uVar13].x - fVar47 * fVar36;
            pIVar16[uVar14 + 1].y = points[uVar13].y - fVar48 * fVar47;
            if (bVar23 == 0) {
              **ppIVar1 = IVar17;
              (*ppIVar1)[1] = IVar26;
              (*ppIVar1)[2] = IVar26 + 2;
              (*ppIVar1)[3] = IVar26 + 2;
              (*ppIVar1)[4] = IVar17 + 2;
              (*ppIVar1)[5] = IVar17;
              IVar29 = IVar17 + 1;
              (*ppIVar1)[6] = IVar29;
              (*ppIVar1)[7] = IVar26 + 1;
              (*ppIVar1)[8] = IVar26;
              lVar34 = 0x18;
              lVar24 = 0x16;
              lVar22 = 0x14;
              lVar15 = 0x12;
            }
            else {
              **ppIVar1 = IVar17;
              (*ppIVar1)[1] = IVar26;
              IVar25 = IVar26 + 1;
              (*ppIVar1)[2] = IVar25;
              IVar26 = IVar17 + 1;
              lVar34 = 0xc;
              lVar24 = 10;
              lVar22 = 8;
              lVar15 = 6;
              IVar29 = IVar17;
              IVar17 = IVar25;
            }
            *(ImDrawIdx *)((long)*ppIVar1 + lVar15) = IVar26;
            *(ImDrawIdx *)((long)*ppIVar1 + lVar22) = IVar17;
            *(ImDrawIdx *)((long)*ppIVar1 + lVar24) = IVar29;
            *ppIVar1 = (ImDrawIdx *)((long)*ppIVar1 + lVar34);
            bVar35 = uVar18 != uVar32;
            uVar18 = uVar18 + 1;
          } while (bVar35);
        }
        if (bVar23 == 0) {
          uVar32 = 1;
          if (1 < points_count) {
            uVar32 = (ulong)(uint)points_count;
          }
          lVar15 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar15);
            this->_VtxWritePtr->uv = IVar3;
            this->_VtxWritePtr->col = col;
            this->_VtxWritePtr[1].pos = *(ImVec2 *)((long)&pIVar12[uVar33].x + lVar15 * 2);
            this->_VtxWritePtr[1].uv = IVar3;
            this->_VtxWritePtr[1].col = uVar31;
            this->_VtxWritePtr[2].pos = *(ImVec2 *)((long)&pIVar12[uVar33 + 1].x + lVar15 * 2);
            this->_VtxWritePtr[2].uv = IVar3;
            this->_VtxWritePtr[2].col = uVar31;
            this->_VtxWritePtr = this->_VtxWritePtr + 3;
            lVar15 = lVar15 + 8;
          } while (uVar32 * 8 != lVar15);
        }
        else {
          uVar32 = 1;
          if (1 < points_count) {
            uVar32 = (ulong)(uint)points_count;
          }
          pIVar5 = this->_Data->TexUvLines;
          pIVar2 = pIVar5 + iVar21;
          fVar36 = pIVar2->x;
          fVar47 = pIVar2->y;
          pIVar5 = pIVar5 + iVar21;
          fVar48 = pIVar5->z;
          fVar45 = pIVar5->w;
          lVar15 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&pIVar12[uVar33].x + lVar15);
            pIVar6 = this->_VtxWritePtr;
            (pIVar6->uv).x = fVar36;
            (pIVar6->uv).y = fVar47;
            this->_VtxWritePtr->col = col;
            this->_VtxWritePtr[1].pos = *(ImVec2 *)((long)&pIVar12[uVar33 + 1].x + lVar15);
            pIVar6 = this->_VtxWritePtr;
            pIVar6[1].uv.x = fVar48;
            pIVar6[1].uv.y = fVar45;
            this->_VtxWritePtr[1].col = col;
            this->_VtxWritePtr = this->_VtxWritePtr + 2;
            lVar15 = lVar15 + 0x10;
          } while (uVar32 * 0x10 != lVar15);
        }
      }
      else {
        fVar36 = (fVar36 - fVar47) * 0.5;
        fVar47 = fVar47 + fVar36;
        if ((flags & 1U) == 0) {
          fVar48 = (*pIVar12).x;
          fVar46 = fVar47 * fVar48;
          fVar45 = (*pIVar12).y;
          fVar44 = fVar47 * fVar45;
          IVar8.y = (*points).y + fVar44;
          IVar8.x = (*points).x + fVar46;
          *pIVar16 = IVar8;
          fVar48 = fVar48 * fVar36;
          fVar45 = fVar45 * fVar36;
          IVar10.y = (*points).y + fVar45;
          IVar10.x = (*points).x + fVar48;
          pIVar16[1] = IVar10;
          IVar11.y = (*points).y - fVar45;
          IVar11.x = (*points).x - fVar48;
          pIVar16[2] = IVar11;
          IVar41.x = (*points).x - fVar46;
          IVar41.y = (*points).y - fVar44;
          pIVar16[3] = IVar41;
          IVar42.x = points[uVar19].x + pIVar12[uVar19].x * fVar47;
          IVar42.y = points[uVar19].y + pIVar12[uVar19].y * fVar47;
          uVar18 = (ulong)(uVar19 * 4);
          pIVar16[uVar18] = IVar42;
          IVar43.x = points[uVar19].x + pIVar12[uVar19].x * fVar36;
          IVar43.y = points[uVar19].y + pIVar12[uVar19].y * fVar36;
          pIVar16[uVar18 + 1] = IVar43;
          IVar9.y = points[uVar19].y - pIVar12[uVar19].y * fVar36;
          IVar9.x = points[uVar19].x - pIVar12[uVar19].x * fVar36;
          pIVar16[uVar18 + 2] = IVar9;
          IVar37.x = points[uVar19].x - pIVar12[uVar19].x * fVar47;
          IVar37.y = points[uVar19].y - pIVar12[uVar19].y * fVar47;
          pIVar16[uVar18 + 3] = IVar37;
        }
        if (0 < (int)uVar27) {
          uVar18 = 1;
          uVar27 = this->_VtxCurrentIdx;
          do {
            uVar13 = uVar18 & 0xffffffff;
            if (uVar33 == uVar18) {
              uVar13 = 0;
            }
            uVar19 = uVar27 + 4;
            if (uVar33 == uVar18) {
              uVar19 = this->_VtxCurrentIdx;
            }
            fVar48 = (pIVar12[uVar13].x + pIVar12[uVar18 - 1].x) * 0.5;
            fVar45 = (pIVar12[uVar13].y + pIVar12[uVar18 - 1].y) * 0.5;
            fVar46 = fVar48 * fVar48 + fVar45 * fVar45;
            if (1e-06 < fVar46) {
              fVar46 = 1.0 / fVar46;
              fVar44 = 100.0;
              if (fVar46 <= 100.0) {
                fVar44 = fVar46;
              }
              fVar48 = fVar48 * fVar44;
              fVar45 = fVar45 * fVar44;
            }
            uVar14 = (ulong)(uint)((int)uVar13 * 4);
            pIVar16[uVar14].x = points[uVar13].x + fVar47 * fVar48;
            pIVar16[uVar14].y = points[uVar13].y + fVar47 * fVar45;
            pIVar16[uVar14 + 1].x = points[uVar13].x + fVar36 * fVar48;
            pIVar16[uVar14 + 1].y = points[uVar13].y + fVar45 * fVar36;
            pIVar16[uVar14 + 2].x = points[uVar13].x - fVar36 * fVar48;
            pIVar16[uVar14 + 2].y = points[uVar13].y - fVar45 * fVar36;
            pIVar16[uVar14 + 3].x = points[uVar13].x - fVar47 * fVar48;
            pIVar16[uVar14 + 3].y = points[uVar13].y - fVar47 * fVar45;
            IVar26 = (ImDrawIdx)uVar19;
            IVar25 = IVar26 + 1;
            *this->_IdxWritePtr = IVar25;
            IVar17 = (ImDrawIdx)uVar27;
            this->_IdxWritePtr[1] = IVar17 + 1;
            IVar29 = IVar17 + 2;
            this->_IdxWritePtr[2] = IVar29;
            this->_IdxWritePtr[3] = IVar29;
            IVar28 = IVar26 + 2;
            this->_IdxWritePtr[4] = IVar28;
            this->_IdxWritePtr[5] = IVar25;
            this->_IdxWritePtr[6] = IVar25;
            this->_IdxWritePtr[7] = IVar17 + 1;
            this->_IdxWritePtr[8] = IVar17;
            this->_IdxWritePtr[9] = IVar17;
            this->_IdxWritePtr[10] = IVar26;
            this->_IdxWritePtr[0xb] = IVar25;
            this->_IdxWritePtr[0xc] = IVar28;
            this->_IdxWritePtr[0xd] = IVar29;
            this->_IdxWritePtr[0xe] = IVar17 + 3;
            this->_IdxWritePtr[0xf] = IVar17 + 3;
            this->_IdxWritePtr[0x10] = IVar26 + 3;
            this->_IdxWritePtr[0x11] = IVar28;
            this->_IdxWritePtr = this->_IdxWritePtr + 0x12;
            bVar35 = uVar18 != uVar32;
            uVar18 = uVar18 + 1;
            uVar27 = uVar19;
          } while (bVar35);
        }
        uVar32 = 1;
        if (1 < points_count) {
          uVar32 = (ulong)(uint)points_count;
        }
        lVar15 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)&pIVar12[uVar33].x + lVar15);
          this->_VtxWritePtr->uv = IVar3;
          this->_VtxWritePtr->col = uVar31;
          this->_VtxWritePtr[1].pos = *(ImVec2 *)((long)&pIVar12[uVar33 + 1].x + lVar15);
          this->_VtxWritePtr[1].uv = IVar3;
          this->_VtxWritePtr[1].col = col;
          this->_VtxWritePtr[2].pos = *(ImVec2 *)((long)&pIVar12[uVar33 + 2].x + lVar15);
          this->_VtxWritePtr[2].uv = IVar3;
          this->_VtxWritePtr[2].col = col;
          this->_VtxWritePtr[3].pos = *(ImVec2 *)((long)&pIVar12[uVar33 + 3].x + lVar15);
          this->_VtxWritePtr[3].uv = IVar3;
          this->_VtxWritePtr[3].col = uVar31;
          this->_VtxWritePtr = this->_VtxWritePtr + 4;
          lVar15 = lVar15 + 0x20;
        } while (uVar32 * 0x20 != lVar15);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (vtx_count & 0xffff);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        _Data->TempBuffer.reserve_discard(points_count * ((use_texture || !thick_line) ? 3 : 5));
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}